

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.h
# Opt level: O0

LockedHandle<perfetto::TrackEvent> * __thiscall
perfetto::DataSource<perfetto::TrackEvent,_perfetto::internal::TrackEventDataSourceTraits>::
TraceContext::GetDataSourceLocked
          (LockedHandle<perfetto::TrackEvent> *__return_storage_ptr__,TraceContext *this)

{
  TrackEvent *obj;
  unique_lock<std::recursive_mutex> local_40;
  undefined1 local_30 [8];
  unique_lock<std::recursive_mutex> lock;
  DataSourceState *internal_state;
  TraceContext *this_local;
  
  lock._8_8_ = internal::DataSourceStaticState::TryGet(&static_state_,(ulong)this->instance_index_);
  if ((DataSourceState *)lock._8_8_ == (DataSourceState *)0x0) {
    memset(__return_storage_ptr__,0,0x18);
    LockedHandle<perfetto::TrackEvent>::LockedHandle(__return_storage_ptr__);
  }
  else {
    ::std::unique_lock<std::recursive_mutex>::unique_lock
              ((unique_lock<std::recursive_mutex> *)local_30,&((DataSourceState *)lock._8_8_)->lock)
    ;
    ::std::unique_lock<std::recursive_mutex>::unique_lock
              (&local_40,(unique_lock<std::recursive_mutex> *)local_30);
    obj = (TrackEvent *)
          ::std::
          unique_ptr<perfetto::DataSourceBase,_std::default_delete<perfetto::DataSourceBase>_>::get
                    ((unique_ptr<perfetto::DataSourceBase,_std::default_delete<perfetto::DataSourceBase>_>
                      *)(lock._8_8_ + 0x60));
    LockedHandle<perfetto::TrackEvent>::LockedHandle(__return_storage_ptr__,&local_40,obj);
    ::std::unique_lock<std::recursive_mutex>::~unique_lock(&local_40);
    ::std::unique_lock<std::recursive_mutex>::~unique_lock
              ((unique_lock<std::recursive_mutex> *)local_30);
  }
  return __return_storage_ptr__;
}

Assistant:

LockedHandle<DataSourceType> GetDataSourceLocked() const {
      auto* internal_state = static_state_.TryGet(instance_index_);
      if (!internal_state)
        return LockedHandle<DataSourceType>();
      std::unique_lock<std::recursive_mutex> lock(internal_state->lock);
      return LockedHandle<DataSourceType>(
          std::move(lock),
          static_cast<DataSourceType*>(internal_state->data_source.get()));
    }